

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_vertical_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  ushort uVar22;
  ushort uVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  unkbyte10 Var38;
  unkbyte10 Var39;
  undefined8 uVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined4 uVar45;
  __m128i alVar47;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar59;
  ushort uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ushort uVar64;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar65 [12];
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  short sVar86;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar87;
  short sVar88;
  short sVar94;
  short sVar96;
  short sVar98;
  short sVar100;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  short sVar95;
  short sVar97;
  short sVar99;
  undefined1 auVar91 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  undefined1 local_3d8 [16];
  ushort local_3c8;
  ushort uStack_3c6;
  ushort uStack_3c4;
  ushort uStack_3c2;
  longlong local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_378;
  undefined8 uStack_370;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  undefined1 local_318 [16];
  undefined8 local_308;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  undefined1 local_2a8 [16];
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  __m128i d7_2;
  undefined1 local_268 [16];
  ushort local_258;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i flat_pq [3];
  ushort local_1e8 [48];
  __m128i p [7];
  __m128i p3_2;
  __m128i p4_2;
  __m128i p5_2;
  __m128i p6_2;
  __m128i p3;
  __m128i p4;
  __m128i p5;
  __m128i p6;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  __m128i abs_p1p0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i hevhev;
  __m128i mask;
  undefined1 auVar46 [12];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  
  p6[0] = *(longlong *)(s + -8);
  p6[1] = *(longlong *)(s + -4);
  p5[0] = *(longlong *)(s + (long)pitch + -8);
  p5[1] = *(longlong *)(s + (long)pitch + -8 + 4);
  lVar43 = (long)(pitch * 2);
  p4[0] = *(longlong *)(s + lVar43 + -8);
  p4[1] = *(longlong *)(s + lVar43 + -8 + 4);
  lVar44 = (long)(pitch * 3);
  p3[0] = *(longlong *)(s + lVar44 + -8);
  p3[1] = *(longlong *)(s + lVar44 + -8 + 4);
  highbd_transpose4x8_8x4_sse2
            (&p6,&p5,&p4,&p3,(__m128i *)local_268,p + 6,p + 5,p + 4,p + 3,p + 2,p + 1,p);
  p6_2[0] = *(longlong *)s;
  p6_2[1] = *(longlong *)(s + 4);
  p5_2[0] = *(longlong *)(s + pitch);
  p5_2[1] = *(longlong *)(s + pitch + 4);
  p4_2[0] = *(longlong *)(s + lVar43);
  p4_2[1] = *(longlong *)(s + lVar43 + 4);
  p3_2[0] = *(longlong *)(s + lVar44);
  p3_2[1] = *(longlong *)(s + lVar44 + 4);
  highbd_transpose4x8_8x4_sse2
            (&p6_2,&p5_2,&p4_2,&p3_2,(__m128i *)&local_308,(__m128i *)&local_2f8,
             (__m128i *)&local_2e8,(__m128i *)&local_2d8,(__m128i *)&local_2c8,(__m128i *)&local_2b8
             ,(__m128i *)local_2a8,&d7_2);
  auVar48 = *(undefined1 (*) [16])blimit;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar48._0_13_;
  auVar5[0xe] = auVar48[7];
  auVar8[0xc] = auVar48[6];
  auVar8._0_12_ = auVar48._0_12_;
  auVar8._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar48._0_11_;
  auVar11._12_3_ = auVar8._12_3_;
  auVar14[10] = auVar48[5];
  auVar14._0_10_ = auVar48._0_10_;
  auVar14._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar48._0_9_;
  auVar17._10_5_ = auVar14._10_5_;
  auVar20[8] = auVar48[4];
  auVar20._0_8_ = auVar48._0_8_;
  auVar20._9_6_ = auVar17._9_6_;
  auVar24._7_8_ = 0;
  auVar24._0_7_ = auVar20._8_7_;
  auVar32._1_8_ = SUB158(auVar24 << 0x40,7);
  auVar32[0] = auVar48[3];
  auVar32._9_6_ = 0;
  auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
  auVar33[0] = auVar48[2];
  auVar33._11_4_ = 0;
  auVar50._3_12_ = SUB1512(auVar33 << 0x20,3);
  auVar50[2] = auVar48[1];
  auVar50[0] = auVar48[0];
  auVar50[1] = 0;
  auVar50[0xf] = 0;
  auVar56 = ZEXT416(bd - 8);
  alVar47 = (__m128i)psllw(auVar50,auVar56);
  blimit_1[0] = alVar47[0];
  blimit_1[1] = alVar47[1];
  auVar48 = *(undefined1 (*) [16])limit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar48._0_13_;
  auVar3[0xe] = auVar48[7];
  auVar6[0xc] = auVar48[6];
  auVar6._0_12_ = auVar48._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar48._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar48[5];
  auVar12._0_10_ = auVar48._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar48._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar48[4];
  auVar18._0_8_ = auVar48._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar25._7_8_ = 0;
  auVar25._0_7_ = auVar18._8_7_;
  auVar34._1_8_ = SUB158(auVar25 << 0x40,7);
  auVar34[0] = auVar48[3];
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = auVar48[2];
  auVar35._11_4_ = 0;
  auVar21[2] = auVar48[1];
  auVar21._0_2_ = auVar48._0_2_;
  auVar21._3_12_ = SUB1512(auVar35 << 0x20,3);
  auVar48._0_2_ = auVar48._0_2_ & 0xff;
  auVar48._2_13_ = auVar21._2_13_;
  auVar48[0xf] = 0;
  alVar47 = (__m128i)psllw(auVar48,auVar56);
  limit_1[0] = alVar47[0];
  limit_1[1] = alVar47[1];
  auVar48 = *(undefined1 (*) [16])thresh;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar48._0_13_;
  auVar4[0xe] = auVar48[7];
  auVar7[0xc] = auVar48[6];
  auVar7._0_12_ = auVar48._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar48._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar48[5];
  auVar13._0_10_ = auVar48._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar48._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar48[4];
  auVar19._0_8_ = auVar48._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar26._7_8_ = 0;
  auVar26._0_7_ = auVar19._8_7_;
  auVar36._1_8_ = SUB158(auVar26 << 0x40,7);
  auVar36[0] = auVar48[3];
  auVar36._9_6_ = 0;
  auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar37[0] = auVar48[2];
  auVar37._11_4_ = 0;
  auVar57._3_12_ = SUB1512(auVar37 << 0x20,3);
  auVar57[2] = auVar48[1];
  auVar57[0] = auVar48[0];
  auVar57[1] = 0;
  auVar57[0xf] = 0;
  alVar47 = (__m128i)psllw(auVar57,auVar56);
  bVar2 = (char)bd - 1U & 0x1f;
  thresh_1[0] = alVar47[0];
  thresh_1[1] = alVar47[1];
  auVar48 = ZEXT416((uint)(1 << bVar2));
  for (uVar41 = (ulong)(uint)(0 << bVar2); uVar41 != 0x70; uVar41 = uVar41 + 0x10) {
    *(undefined8 *)((long)&local_378 + uVar41) = *(undefined8 *)((long)p[0] + uVar41);
    *(undefined8 *)((long)&uStack_370 + uVar41) = *(undefined8 *)((long)&local_308 + uVar41);
  }
  auVar48 = pshuflw(auVar48,auVar48,0);
  local_3d8._4_4_ = auVar48._0_4_;
  local_3d8._0_4_ = local_3d8._4_4_;
  local_3d8._8_4_ = local_3d8._4_4_;
  local_3d8._12_4_ = local_3d8._4_4_;
  highbd_hev_filter_mask_x_sse2
            ((__m128i *)&local_378,4,&p1p0,&q1q0,&abs_p1p0,&limit_1,&blimit_1,&thresh_1,&hevhev,
             &mask);
  auVar48 = psllw(_DAT_004685f0,ZEXT416((uint)bd));
  auVar102._8_4_ = 0xffffffff;
  auVar102._0_8_ = 0xffffffffffffffff;
  auVar102._12_4_ = 0xffffffff;
  auVar48 = paddsw(auVar48,auVar102);
  auVar48 = psubsw(auVar48,local_3d8);
  auVar50 = psubsw((undefined1  [16])0x0,local_3d8);
  auVar57 = psubsw((undefined1  [16])p1p0,local_3d8);
  auVar102 = psubsw((undefined1  [16])q1q0,local_3d8);
  auVar56 = psubsw(auVar57,auVar102);
  sVar117 = auVar48._0_2_;
  sVar87 = auVar56._0_2_;
  uVar74 = (ushort)(sVar117 < sVar87) * sVar117 | (ushort)(sVar117 >= sVar87) * sVar87;
  sVar118 = auVar48._2_2_;
  sVar87 = auVar56._2_2_;
  uVar79 = (ushort)(sVar118 < sVar87) * sVar118 | (ushort)(sVar118 >= sVar87) * sVar87;
  sVar119 = auVar48._4_2_;
  sVar87 = auVar56._4_2_;
  uVar80 = (ushort)(sVar119 < sVar87) * sVar119 | (ushort)(sVar119 >= sVar87) * sVar87;
  sVar120 = auVar48._6_2_;
  sVar87 = auVar56._6_2_;
  uVar81 = (ushort)(sVar120 < sVar87) * sVar120 | (ushort)(sVar120 >= sVar87) * sVar87;
  sVar88 = auVar48._8_2_;
  sVar87 = auVar56._8_2_;
  uVar82 = (ushort)(sVar88 < sVar87) * sVar88 | (ushort)(sVar88 >= sVar87) * sVar87;
  sVar95 = auVar48._10_2_;
  sVar87 = auVar56._10_2_;
  uVar83 = (ushort)(sVar95 < sVar87) * sVar95 | (ushort)(sVar95 >= sVar87) * sVar87;
  sVar97 = auVar48._12_2_;
  sVar87 = auVar56._12_2_;
  sVar94 = auVar56._14_2_;
  uVar84 = (ushort)(sVar97 < sVar87) * sVar97 | (ushort)(sVar97 >= sVar87) * sVar87;
  sVar99 = auVar48._14_2_;
  uVar85 = (ushort)(sVar99 < sVar94) * sVar99 | (ushort)(sVar99 >= sVar94) * sVar94;
  sVar87 = auVar50._0_2_;
  auVar75._0_2_ = (ushort)((short)uVar74 < sVar87) * sVar87 | ((short)uVar74 >= sVar87) * uVar74;
  sVar94 = auVar50._2_2_;
  auVar75._2_2_ = (ushort)((short)uVar79 < sVar94) * sVar94 | ((short)uVar79 >= sVar94) * uVar79;
  sVar96 = auVar50._4_2_;
  auVar75._4_2_ = (ushort)((short)uVar80 < sVar96) * sVar96 | ((short)uVar80 >= sVar96) * uVar80;
  sVar98 = auVar50._6_2_;
  auVar75._6_2_ = (ushort)((short)uVar81 < sVar98) * sVar98 | ((short)uVar81 >= sVar98) * uVar81;
  sVar113 = auVar50._8_2_;
  auVar75._8_2_ = (ushort)((short)uVar82 < sVar113) * sVar113 | ((short)uVar82 >= sVar113) * uVar82;
  sVar114 = auVar50._10_2_;
  auVar75._10_2_ = (ushort)((short)uVar83 < sVar114) * sVar114 | ((short)uVar83 >= sVar114) * uVar83
  ;
  sVar115 = auVar50._12_2_;
  auVar75._12_2_ = (ushort)((short)uVar84 < sVar115) * sVar115 | ((short)uVar84 >= sVar115) * uVar84
  ;
  sVar116 = auVar50._14_2_;
  auVar75._14_2_ = (ushort)((short)uVar85 < sVar116) * sVar116 | ((short)uVar85 >= sVar116) * uVar85
  ;
  auVar48 = psubsw(auVar75 >> 0x40 & (undefined1  [16])hevhev,auVar75);
  auVar48 = psubsw(auVar48,auVar75);
  auVar48 = psubsw(auVar48,auVar75);
  sVar59 = auVar48._0_2_;
  uVar74 = (ushort)(sVar117 < sVar59) * sVar117 | (ushort)(sVar117 >= sVar59) * sVar59;
  sVar59 = auVar48._2_2_;
  uVar79 = (ushort)(sVar118 < sVar59) * sVar118 | (ushort)(sVar118 >= sVar59) * sVar59;
  sVar59 = auVar48._4_2_;
  uVar80 = (ushort)(sVar119 < sVar59) * sVar119 | (ushort)(sVar119 >= sVar59) * sVar59;
  sVar59 = auVar48._6_2_;
  uVar81 = (ushort)(sVar120 < sVar59) * sVar120 | (ushort)(sVar120 >= sVar59) * sVar59;
  sVar59 = auVar48._8_2_;
  uVar82 = (ushort)(sVar88 < sVar59) * sVar88 | (ushort)(sVar88 >= sVar59) * sVar59;
  sVar59 = auVar48._10_2_;
  uVar83 = (ushort)(sVar95 < sVar59) * sVar95 | (ushort)(sVar95 >= sVar59) * sVar59;
  sVar59 = auVar48._12_2_;
  sVar86 = auVar48._14_2_;
  uVar84 = (ushort)(sVar97 < sVar59) * sVar97 | (ushort)(sVar97 >= sVar59) * sVar59;
  uVar85 = (ushort)(sVar99 < sVar86) * sVar99 | (ushort)(sVar99 >= sVar86) * sVar86;
  auVar89._0_2_ = (ushort)((short)uVar74 < sVar87) * sVar87 | ((short)uVar74 >= sVar87) * uVar74;
  auVar89._2_2_ = (ushort)((short)uVar79 < sVar94) * sVar94 | ((short)uVar79 >= sVar94) * uVar79;
  auVar89._4_2_ = (ushort)((short)uVar80 < sVar96) * sVar96 | ((short)uVar80 >= sVar96) * uVar80;
  auVar89._6_2_ = (ushort)((short)uVar81 < sVar98) * sVar98 | ((short)uVar81 >= sVar98) * uVar81;
  auVar89._8_2_ = (ushort)((short)uVar82 < sVar113) * sVar113 | ((short)uVar82 >= sVar113) * uVar82;
  auVar89._10_2_ = (ushort)((short)uVar83 < sVar114) * sVar114 | ((short)uVar83 >= sVar114) * uVar83
  ;
  auVar89._12_2_ = (ushort)((short)uVar84 < sVar115) * sVar115 | ((short)uVar84 >= sVar115) * uVar84
  ;
  auVar89._14_2_ = (ushort)((short)uVar85 < sVar116) * sVar116 | ((short)uVar85 >= sVar116) * uVar85
  ;
  auVar89 = auVar89 & (undefined1  [16])mask;
  auVar76._0_8_ = auVar89._0_8_;
  auVar76._8_4_ = auVar89._0_4_;
  auVar76._12_4_ = auVar89._4_4_;
  auVar48 = paddsw(auVar76,_DAT_00468600);
  sVar59 = auVar48._0_2_;
  uVar74 = (ushort)(sVar117 < sVar59) * sVar117 | (ushort)(sVar117 >= sVar59) * sVar59;
  sVar59 = auVar48._2_2_;
  uVar79 = (ushort)(sVar118 < sVar59) * sVar118 | (ushort)(sVar118 >= sVar59) * sVar59;
  sVar59 = auVar48._4_2_;
  uVar80 = (ushort)(sVar119 < sVar59) * sVar119 | (ushort)(sVar119 >= sVar59) * sVar59;
  sVar59 = auVar48._6_2_;
  uVar81 = (ushort)(sVar120 < sVar59) * sVar120 | (ushort)(sVar120 >= sVar59) * sVar59;
  sVar59 = auVar48._8_2_;
  uVar82 = (ushort)(sVar88 < sVar59) * sVar88 | (ushort)(sVar88 >= sVar59) * sVar59;
  sVar59 = auVar48._10_2_;
  uVar83 = (ushort)(sVar95 < sVar59) * sVar95 | (ushort)(sVar95 >= sVar59) * sVar59;
  sVar59 = auVar48._12_2_;
  sVar86 = auVar48._14_2_;
  uVar84 = (ushort)(sVar97 < sVar59) * sVar97 | (ushort)(sVar97 >= sVar59) * sVar59;
  uVar85 = (ushort)(sVar99 < sVar86) * sVar99 | (ushort)(sVar99 >= sVar86) * sVar86;
  auVar77._0_2_ = (ushort)((short)uVar74 < sVar87) * sVar87 | ((short)uVar74 >= sVar87) * uVar74;
  auVar77._2_2_ = (ushort)((short)uVar79 < sVar94) * sVar94 | ((short)uVar79 >= sVar94) * uVar79;
  auVar77._4_2_ = (ushort)((short)uVar80 < sVar96) * sVar96 | ((short)uVar80 >= sVar96) * uVar80;
  auVar77._6_2_ = (ushort)((short)uVar81 < sVar98) * sVar98 | ((short)uVar81 >= sVar98) * uVar81;
  auVar77._8_2_ = (ushort)((short)uVar82 < sVar113) * sVar113 | ((short)uVar82 >= sVar113) * uVar82;
  auVar77._10_2_ = (ushort)((short)uVar83 < sVar114) * sVar114 | ((short)uVar83 >= sVar114) * uVar83
  ;
  auVar77._12_2_ = (ushort)((short)uVar84 < sVar115) * sVar115 | ((short)uVar84 >= sVar115) * uVar84
  ;
  auVar77._14_2_ = (ushort)((short)uVar85 < sVar116) * sVar116 | ((short)uVar85 >= sVar116) * uVar85
  ;
  auVar48 = psraw(auVar77,3);
  auVar90._0_2_ = auVar48._0_2_ + 1;
  auVar90._2_2_ = auVar48._2_2_ + 1;
  auVar90._4_2_ = auVar48._4_2_ + 1;
  auVar90._6_2_ = auVar48._6_2_ + 1;
  auVar90._8_2_ = auVar48._0_2_ + 1;
  auVar90._10_2_ = auVar48._2_2_ + 1;
  auVar90._12_2_ = auVar48._4_2_ + 1;
  auVar90._14_2_ = auVar48._6_2_ + 1;
  auVar50 = psraw(auVar90,1);
  auVar61._8_8_ = SUB168(~(undefined1  [16])hevhev & auVar50,8);
  auVar61._0_8_ = auVar48._8_8_;
  auVar78._8_8_ = SUB168(~(undefined1  [16])hevhev & auVar50,0);
  auVar78._0_8_ = auVar48._0_8_;
  auVar50 = psubsw(auVar102,auVar78);
  auVar48 = paddsw(auVar61,auVar57);
  sVar59 = auVar50._0_2_;
  uVar74 = (ushort)(sVar117 < sVar59) * sVar117 | (ushort)(sVar117 >= sVar59) * sVar59;
  sVar59 = auVar50._2_2_;
  uVar79 = (ushort)(sVar118 < sVar59) * sVar118 | (ushort)(sVar118 >= sVar59) * sVar59;
  sVar59 = auVar50._4_2_;
  uVar80 = (ushort)(sVar119 < sVar59) * sVar119 | (ushort)(sVar119 >= sVar59) * sVar59;
  sVar59 = auVar50._6_2_;
  uVar81 = (ushort)(sVar120 < sVar59) * sVar120 | (ushort)(sVar120 >= sVar59) * sVar59;
  sVar59 = auVar50._8_2_;
  uVar82 = (ushort)(sVar88 < sVar59) * sVar88 | (ushort)(sVar88 >= sVar59) * sVar59;
  sVar59 = auVar50._10_2_;
  uVar83 = (ushort)(sVar95 < sVar59) * sVar95 | (ushort)(sVar95 >= sVar59) * sVar59;
  sVar59 = auVar50._12_2_;
  sVar86 = auVar50._14_2_;
  uVar84 = (ushort)(sVar97 < sVar59) * sVar97 | (ushort)(sVar97 >= sVar59) * sVar59;
  uVar85 = (ushort)(sVar99 < sVar86) * sVar99 | (ushort)(sVar99 >= sVar86) * sVar86;
  auVar103._0_2_ = (ushort)((short)uVar74 < sVar87) * sVar87 | ((short)uVar74 >= sVar87) * uVar74;
  auVar103._2_2_ = (ushort)((short)uVar79 < sVar94) * sVar94 | ((short)uVar79 >= sVar94) * uVar79;
  auVar103._4_2_ = (ushort)((short)uVar80 < sVar96) * sVar96 | ((short)uVar80 >= sVar96) * uVar80;
  auVar103._6_2_ = (ushort)((short)uVar81 < sVar98) * sVar98 | ((short)uVar81 >= sVar98) * uVar81;
  auVar103._8_2_ = (ushort)((short)uVar82 < sVar113) * sVar113 | ((short)uVar82 >= sVar113) * uVar82
  ;
  auVar103._10_2_ =
       (ushort)((short)uVar83 < sVar114) * sVar114 | ((short)uVar83 >= sVar114) * uVar83;
  auVar103._12_2_ =
       (ushort)((short)uVar84 < sVar115) * sVar115 | ((short)uVar84 >= sVar115) * uVar84;
  auVar103._14_2_ =
       (ushort)((short)uVar85 < sVar116) * sVar116 | ((short)uVar85 >= sVar116) * uVar85;
  sVar59 = auVar48._0_2_;
  uVar74 = (ushort)(sVar117 < sVar59) * sVar117 | (ushort)(sVar117 >= sVar59) * sVar59;
  sVar117 = auVar48._2_2_;
  uVar79 = (ushort)(sVar118 < sVar117) * sVar118 | (ushort)(sVar118 >= sVar117) * sVar117;
  sVar117 = auVar48._4_2_;
  uVar80 = (ushort)(sVar119 < sVar117) * sVar119 | (ushort)(sVar119 >= sVar117) * sVar117;
  sVar117 = auVar48._6_2_;
  uVar81 = (ushort)(sVar120 < sVar117) * sVar120 | (ushort)(sVar120 >= sVar117) * sVar117;
  sVar117 = auVar48._8_2_;
  uVar82 = (ushort)(sVar88 < sVar117) * sVar88 | (ushort)(sVar88 >= sVar117) * sVar117;
  sVar117 = auVar48._10_2_;
  uVar83 = (ushort)(sVar95 < sVar117) * sVar95 | (ushort)(sVar95 >= sVar117) * sVar117;
  sVar117 = auVar48._12_2_;
  sVar118 = auVar48._14_2_;
  uVar84 = (ushort)(sVar97 < sVar117) * sVar97 | (ushort)(sVar97 >= sVar117) * sVar117;
  uVar85 = (ushort)(sVar99 < sVar118) * sVar99 | (ushort)(sVar99 >= sVar118) * sVar118;
  auVar62._0_2_ = (ushort)((short)uVar74 < sVar87) * sVar87 | ((short)uVar74 >= sVar87) * uVar74;
  auVar62._2_2_ = (ushort)((short)uVar79 < sVar94) * sVar94 | ((short)uVar79 >= sVar94) * uVar79;
  auVar62._4_2_ = (ushort)((short)uVar80 < sVar96) * sVar96 | ((short)uVar80 >= sVar96) * uVar80;
  auVar62._6_2_ = (ushort)((short)uVar81 < sVar98) * sVar98 | ((short)uVar81 >= sVar98) * uVar81;
  auVar62._8_2_ = (ushort)((short)uVar82 < sVar113) * sVar113 | ((short)uVar82 >= sVar113) * uVar82;
  auVar62._10_2_ = (ushort)((short)uVar83 < sVar114) * sVar114 | ((short)uVar83 >= sVar114) * uVar83
  ;
  auVar62._12_2_ = (ushort)((short)uVar84 < sVar115) * sVar115 | ((short)uVar84 >= sVar115) * uVar84
  ;
  auVar62._14_2_ = (ushort)((short)uVar85 < sVar116) * sVar116 | ((short)uVar85 >= sVar116) * uVar85
  ;
  auVar50 = paddsw(auVar103,local_3d8);
  auVar48 = paddsw(auVar62,local_3d8);
  local_268._0_12_ = local_268._2_12_;
  local_2a8._0_12_ = local_2a8._2_12_;
  highbd_flat_mask4_sse2((__m128i *)&local_378,(__m128i *)&local_98,(__m128i *)&local_258,bd);
  local_3c8 = (ushort)mask[0];
  uStack_3c6 = mask[0]._2_2_;
  uStack_3c4 = mask[0]._4_2_;
  uStack_3c2 = mask[0]._6_2_;
  local_3c8 = local_3c8 & local_98;
  uStack_3c6 = uStack_3c6 & uStack_96;
  uStack_3c4 = uStack_3c4 & uStack_94;
  uStack_3c2 = uStack_3c2 & uStack_92;
  auVar56._0_2_ = -(ushort)(local_3c8 == 0);
  auVar56._2_2_ = -(ushort)(uStack_3c6 == 0);
  auVar56._4_2_ = -(ushort)(uStack_3c4 == 0);
  auVar56._6_2_ = -(ushort)(uStack_3c2 == 0);
  auVar56._8_2_ = -(ushort)(local_3c8 == 0);
  auVar56._10_2_ = -(ushort)(uStack_3c6 == 0);
  auVar56._12_2_ = -(ushort)(uStack_3c4 == 0);
  auVar56._14_2_ = -(ushort)(uStack_3c2 == 0);
  local_3d8._8_8_ = auVar48._8_8_;
  uStack_3b0 = auVar50._8_8_;
  uVar40 = uStack_3b0;
  uStack_3b0._0_2_ = auVar50._8_2_;
  uStack_3b0._2_2_ = auVar50._10_2_;
  uStack_3b0._4_2_ = auVar50._12_2_;
  uStack_3b0._6_2_ = auVar50._14_2_;
  if ((ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) | (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar56._14_2_ >> 7) & 1) << 0xe | auVar56._14_2_ & 0x8000) == 0xffff
     ) {
    local_3d8._0_2_ = auVar48._0_2_;
    local_3d8._2_2_ = auVar48._2_2_;
    local_3d8._4_2_ = auVar48._4_2_;
    local_3d8._6_2_ = auVar48._6_2_;
    auVar108._8_8_ = uVar40;
    auVar108._0_8_ = local_3d8._8_8_;
    local_378._0_2_ = local_3d8._0_2_;
    local_378._2_2_ = local_3d8._2_2_;
    local_378._4_2_ = local_3d8._4_2_;
    local_378._6_2_ = local_3d8._6_2_;
    uStack_370._0_2_ = (undefined2)uStack_3b0;
    uStack_370._2_2_ = uStack_3b0._2_2_;
    uStack_370._4_2_ = uStack_3b0._4_2_;
    uStack_370._6_2_ = uStack_3b0._6_2_;
  }
  else {
    local_258 = local_258 & local_3c8;
    uStack_256 = uStack_256 & uStack_3c6;
    uStack_254 = uStack_254 & uStack_3c4;
    uStack_252 = uStack_252 & uStack_3c2;
    uStack_250 = uStack_250 & local_3c8;
    uStack_24e = uStack_24e & uStack_3c6;
    uVar79 = (ushort)thresh_1[0] & uStack_3c4;
    uVar80 = thresh_1[0]._2_2_ & uStack_3c2;
    sVar113 = local_368 + (short)local_378 + local_358;
    sVar114 = sStack_366 + local_378._2_2_ + sStack_356;
    sVar115 = sStack_364 + local_378._4_2_ + sStack_354;
    sVar116 = sStack_362 + local_378._6_2_ + sStack_352;
    sVar117 = sStack_360 + (short)uStack_370 + sStack_350;
    sVar118 = sStack_35e + uStack_370._2_2_ + sStack_34e;
    sVar119 = sStack_35c + uStack_370._4_2_ + sStack_34c;
    sVar120 = sStack_35a + uStack_370._6_2_ + sStack_34a;
    sVar87 = sVar117 + sVar113 + 4;
    sVar94 = sVar118 + sVar114 + 4;
    sVar96 = sVar119 + sVar115 + 4;
    sVar98 = sVar120 + sVar116 + 4;
    flat_pq[0][0]._0_2_ = (ushort)((short)local_378 + local_348 + sVar87) >> 3;
    flat_pq[0][0]._2_2_ = (ushort)(local_378._2_2_ + sStack_346 + sVar94) >> 3;
    flat_pq[0][0]._4_2_ = (ushort)(local_378._4_2_ + sStack_344 + sVar96) >> 3;
    flat_pq[0][0]._6_2_ = (ushort)(local_378._6_2_ + sStack_342 + sVar98) >> 3;
    flat_pq[0][1]._0_2_ = (ushort)((short)local_308 + local_2d8 + sVar87) >> 3;
    flat_pq[0][1]._2_2_ = (ushort)(local_308._2_2_ + sStack_2d6 + sVar94) >> 3;
    flat_pq[0][1]._4_2_ = (ushort)(local_308._4_2_ + sStack_2d4 + sVar96) >> 3;
    flat_pq[0][1]._6_2_ = (ushort)(local_308._6_2_ + sStack_2d2 + sVar98) >> 3;
    flat_pq[1][0]._0_2_ = (ushort)((sVar87 - local_2e8) + local_348 * 2 + local_368) >> 3;
    flat_pq[1][0]._2_2_ = (ushort)((sVar94 - sStack_2e6) + sStack_346 * 2 + sStack_366) >> 3;
    flat_pq[1][0]._4_2_ = (ushort)((sVar96 - sStack_2e4) + sStack_344 * 2 + sStack_364) >> 3;
    flat_pq[1][0]._6_2_ = (ushort)((sVar98 - sStack_2e2) + sStack_342 * 2 + sStack_362) >> 3;
    flat_pq[1][1]._0_2_ = (ushort)((sVar87 - local_358) + sStack_340 * 2 + sStack_360) >> 3;
    flat_pq[1][1]._2_2_ = (ushort)((sVar94 - sStack_356) + sStack_33e * 2 + sStack_35e) >> 3;
    flat_pq[1][1]._4_2_ = (ushort)((sVar96 - sStack_354) + sStack_33c * 2 + sStack_35c) >> 3;
    flat_pq[1][1]._6_2_ = (ushort)((sVar98 - sStack_352) + sStack_33a * 2 + sStack_35a) >> 3;
    flat_pq[2][0]._0_2_ =
         (ushort)(((sVar87 - local_2e8) + local_348 * 3 + local_358) - local_2f8) >> 3;
    flat_pq[2][0]._2_2_ =
         (ushort)(((sVar94 - sStack_2e6) + sStack_346 * 3 + sStack_356) - sStack_2f6) >> 3;
    flat_pq[2][0]._4_2_ =
         (ushort)(((sVar96 - sStack_2e4) + sStack_344 * 3 + sStack_354) - sStack_2f4) >> 3;
    flat_pq[2][0]._6_2_ =
         (ushort)(((sVar98 - sStack_2e2) + sStack_342 * 3 + sStack_352) - sStack_2f2) >> 3;
    flat_pq[2][1]._0_2_ =
         (ushort)(((sStack_340 * 3 + sStack_350) - local_368) + (sVar87 - local_358)) >> 3;
    flat_pq[2][1]._2_2_ =
         (ushort)(((sStack_33e * 3 + sStack_34e) - sStack_366) + (sVar94 - sStack_356)) >> 3;
    flat_pq[2][1]._4_2_ =
         (ushort)(((sStack_33c * 3 + sStack_34c) - sStack_364) + (sVar96 - sStack_354)) >> 3;
    flat_pq[2][1]._6_2_ =
         (ushort)(((sStack_33a * 3 + sStack_34a) - sStack_362) + (sVar98 - sStack_352)) >> 3;
    auVar112._0_2_ = -(ushort)(local_258 == 0);
    auVar112._2_2_ = -(ushort)(uStack_256 == 0);
    auVar112._4_2_ = -(ushort)(uStack_254 == 0);
    auVar112._6_2_ = -(ushort)(uStack_252 == 0);
    auVar112._8_2_ = -(ushort)(uStack_250 == 0);
    auVar112._10_2_ = -(ushort)(uStack_24e == 0);
    auVar112._12_2_ = -(ushort)(uVar79 == 0);
    auVar112._14_2_ = -(ushort)(uVar80 == 0);
    uVar74 = ((ushort)(SUB161(auVar112 >> 7,0) & 1) | (ushort)(SUB161(auVar112 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar112 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar112 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar112 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar112 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar112 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar112 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar112 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar112 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar112 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar112 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar112 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar112 >> 0x6f,0) & 1) << 0xd |
              (ushort)((byte)(auVar112._14_2_ >> 7) & 1) << 0xe | auVar112._14_2_ & 0x8000) ^ 0xffff
    ;
    if (uVar74 != 0) {
      sVar88 = local_318._0_2_;
      sVar95 = local_318._2_2_;
      sVar97 = local_318._4_2_;
      sVar99 = local_318._6_2_;
      sVar59 = local_318._8_2_;
      sVar86 = local_318._10_2_;
      sVar100 = local_318._12_2_;
      sVar104 = local_318._14_2_;
      local_288 = local_2e8;
      sStack_286 = sStack_2e6;
      sStack_284 = sStack_2e4;
      sStack_282 = sStack_2e2;
      uStack_280 = uStack_2e0;
      uStack_27e = uStack_2de;
      uStack_27c = uStack_2dc;
      uStack_27a = uStack_2da;
      sVar121 = local_338 + local_328 + local_348;
      sVar122 = sStack_336 + sStack_326 + sStack_346;
      sVar123 = sStack_334 + sStack_324 + sStack_344;
      sVar124 = sStack_332 + sStack_322 + sStack_342;
      sVar125 = sStack_330 + sStack_320 + sStack_340;
      sVar126 = sStack_32e + sStack_31e + sStack_33e;
      sVar127 = sStack_32c + sStack_31c + sStack_33c;
      sVar128 = sStack_32a + sStack_31a + sStack_33a;
      local_298 = local_368;
      sStack_296 = sStack_366;
      sStack_294 = sStack_364;
      sStack_292 = sStack_362;
      sStack_290 = sStack_360;
      sStack_28e = sStack_35e;
      sStack_28c = sStack_35c;
      sStack_28a = sStack_35a;
      sVar87 = sVar117 + sVar125 + sVar113 + sVar121 + 8;
      sVar94 = sVar118 + sVar126 + sVar114 + sVar122 + 8;
      sVar96 = sVar119 + sVar127 + sVar115 + sVar123 + 8;
      sVar98 = sVar120 + sVar128 + sVar116 + sVar124 + 8;
      local_1e8[0] = (ushort)(sVar87 + (short)local_308 + local_368 + (short)local_378 + sVar88) >>
                     4;
      local_1e8[1] = (ushort)(sVar94 + local_308._2_2_ + sStack_366 + local_378._2_2_ + sVar95) >> 4
      ;
      local_1e8[2] = (ushort)(sVar96 + local_308._4_2_ + sStack_364 + local_378._4_2_ + sVar97) >> 4
      ;
      local_1e8[3] = (ushort)(sVar98 + local_308._6_2_ + sStack_362 + local_378._6_2_ + sVar99) >> 4
      ;
      local_1e8[4] = (ushort)(sStack_360 + (short)uStack_370 + sVar59 + (short)local_378 + sVar87)
                     >> 4;
      local_1e8[5] = (ushort)(sStack_35e + uStack_370._2_2_ + sVar86 + local_378._2_2_ + sVar94) >>
                     4;
      local_1e8[6] = (ushort)(sStack_35c + uStack_370._4_2_ + sVar100 + local_378._4_2_ + sVar96) >>
                     4;
      local_1e8[7] = (ushort)(sStack_35a + uStack_370._6_2_ + sVar104 + local_378._6_2_ + sVar98) >>
                     4;
      local_1e8[8] = (ushort)((sVar87 - local_2b8) + sVar88 * 2 + sVar113) >> 4;
      local_1e8[9] = (ushort)((sVar94 - sStack_2b6) + sVar95 * 2 + sVar114) >> 4;
      local_1e8[10] = (ushort)((sVar96 - sStack_2b4) + sVar97 * 2 + sVar115) >> 4;
      local_1e8[0xb] = (ushort)((sVar98 - sStack_2b2) + sVar99 * 2 + sVar116) >> 4;
      local_1e8[0xc] = (ushort)((sVar87 - local_328) + sVar59 * 2 + sVar117) >> 4;
      local_1e8[0xd] = (ushort)((sVar94 - sStack_326) + sVar86 * 2 + sVar118) >> 4;
      local_1e8[0xe] = (ushort)((sVar96 - sStack_324) + sVar100 * 2 + sVar119) >> 4;
      local_1e8[0xf] = (ushort)((sVar98 - sStack_322) + sVar104 * 2 + sVar120) >> 4;
      local_2c8 = (sVar87 - local_2b8) - local_2c8;
      sStack_2c6 = (sVar94 - sStack_2b6) - sStack_2c6;
      sStack_2c4 = (sVar96 - sStack_2b4) - sStack_2c4;
      sStack_2c2 = (sVar98 - sStack_2b2) - sStack_2c2;
      sVar87 = (sVar87 - local_328) - local_338;
      sVar94 = (sVar94 - sStack_326) - sStack_336;
      sVar96 = (sVar96 - sStack_324) - sStack_334;
      sVar98 = (sVar98 - sStack_322) - sStack_332;
      local_1e8[0x10] = (ushort)(local_2c8 + local_368 + local_358 + local_348 + sVar88 * 3) >> 4;
      local_1e8[0x11] =
           (ushort)(sStack_2c6 + sStack_366 + sStack_356 + sStack_346 + sVar95 * 3) >> 4;
      local_1e8[0x12] =
           (ushort)(sStack_2c4 + sStack_364 + sStack_354 + sStack_344 + sVar97 * 3) >> 4;
      local_1e8[0x13] =
           (ushort)(sStack_2c2 + sStack_362 + sStack_352 + sStack_342 + sVar99 * 3) >> 4;
      local_1e8[0x14] = (ushort)(sVar87 + sStack_360 + sStack_350 + sStack_340 + sVar59 * 3) >> 4;
      local_1e8[0x15] = (ushort)(sVar94 + sStack_35e + sStack_34e + sStack_33e + sVar86 * 3) >> 4;
      local_1e8[0x16] = (ushort)(sVar96 + sStack_35c + sStack_34c + sStack_33c + sVar100 * 3) >> 4;
      local_1e8[0x17] = (ushort)(sVar98 + sStack_35a + sStack_34a + sStack_33a + sVar104 * 3) >> 4;
      local_2c8 = local_2c8 - local_2d8;
      sStack_2c6 = sStack_2c6 - sStack_2d6;
      sStack_2c4 = sStack_2c4 - sStack_2d4;
      sStack_2c2 = sStack_2c2 - sStack_2d2;
      sVar87 = sVar87 - local_348;
      sVar94 = sVar94 - sStack_346;
      sVar96 = sVar96 - sStack_344;
      sVar98 = sVar98 - sStack_342;
      auVar57 = psllw(local_318,2);
      local_1e8[0x18] = (ushort)(local_2c8 + local_348 + local_338 + local_358 + auVar57._0_2_) >> 4
      ;
      local_1e8[0x19] =
           (ushort)(sStack_2c6 + sStack_346 + sStack_336 + sStack_356 + auVar57._2_2_) >> 4;
      local_1e8[0x1a] =
           (ushort)(sStack_2c4 + sStack_344 + sStack_334 + sStack_354 + auVar57._4_2_) >> 4;
      local_1e8[0x1b] =
           (ushort)(sStack_2c2 + sStack_342 + sStack_332 + sStack_352 + auVar57._6_2_) >> 4;
      local_1e8[0x1c] = (ushort)(sVar87 + sStack_340 + sStack_330 + sStack_350 + auVar57._8_2_) >> 4
      ;
      local_1e8[0x1d] =
           (ushort)(sVar94 + sStack_33e + sStack_32e + sStack_34e + auVar57._10_2_) >> 4;
      local_1e8[0x1e] =
           (ushort)(sVar96 + sStack_33c + sStack_32c + sStack_34c + auVar57._12_2_) >> 4;
      local_1e8[0x1f] =
           (ushort)(sVar98 + sStack_33a + sStack_32a + sStack_34a + auVar57._14_2_) >> 4;
      local_2c8 = local_2c8 - local_2e8;
      sStack_2c6 = sStack_2c6 - sStack_2e6;
      sStack_2c4 = sStack_2c4 - sStack_2e4;
      sStack_2c2 = sStack_2c2 - sStack_2e2;
      sVar87 = sVar87 - local_358;
      sVar94 = sVar94 - sStack_356;
      sVar96 = sVar96 - sStack_354;
      sVar98 = sVar98 - sStack_352;
      local_1e8[0x20] = (ushort)(local_2c8 + sVar88 * 5 + sVar121) >> 4;
      local_1e8[0x21] = (ushort)(sStack_2c6 + sVar95 * 5 + sVar122) >> 4;
      local_1e8[0x22] = (ushort)(sStack_2c4 + sVar97 * 5 + sVar123) >> 4;
      local_1e8[0x23] = (ushort)(sStack_2c2 + sVar99 * 5 + sVar124) >> 4;
      local_1e8[0x24] = (ushort)(sVar87 + sVar59 * 5 + sVar125) >> 4;
      local_1e8[0x25] = (ushort)(sVar94 + sVar86 * 5 + sVar126) >> 4;
      local_1e8[0x26] = (ushort)(sVar96 + sVar100 * 5 + sVar127) >> 4;
      local_1e8[0x27] = (ushort)(sVar98 + sVar104 * 5 + sVar128) >> 4;
      local_1e8[0x28] =
           (ushort)(((local_338 + local_328 + sVar88 * 7) - local_2f8) + local_2c8) >> 4;
      local_1e8[0x29] =
           (ushort)(((sStack_336 + sStack_326 + sVar95 * 7) - sStack_2f6) + sStack_2c6) >> 4;
      local_1e8[0x2a] =
           (ushort)(((sStack_334 + sStack_324 + sVar97 * 7) - sStack_2f4) + sStack_2c4) >> 4;
      local_1e8[0x2b] =
           (ushort)(((sStack_332 + sStack_322 + sVar99 * 7) - sStack_2f2) + sStack_2c2) >> 4;
      local_1e8[0x2c] = (ushort)(((sStack_330 + sStack_320 + sVar59 * 7) - local_368) + sVar87) >> 4
      ;
      local_1e8[0x2d] =
           (ushort)(((sStack_32e + sStack_31e + sVar86 * 7) - sStack_366) + sVar94) >> 4;
      local_1e8[0x2e] =
           (ushort)(((sStack_32c + sStack_31c + sVar100 * 7) - sStack_364) + sVar96) >> 4;
      local_1e8[0x2f] =
           (ushort)(((sStack_32a + sStack_31a + sVar104 * 7) - sStack_362) + sVar98) >> 4;
    }
    local_3d8._0_8_ = auVar48._0_8_;
    local_3b8 = auVar50._0_8_;
    local_378 = local_3d8._0_8_;
    uStack_370 = local_3b8;
    local_368 = auVar48._8_2_;
    sStack_366 = auVar48._10_2_;
    sStack_364 = auVar48._12_2_;
    sStack_362 = auVar48._14_2_;
    sStack_360 = (undefined2)uStack_3b0;
    sStack_35e = uStack_3b0._2_2_;
    sStack_35c = uStack_3b0._4_2_;
    sStack_35a = uStack_3b0._6_2_;
    for (lVar42 = 0; lVar42 != 0x30; lVar42 = lVar42 + 0x10) {
      uVar81 = *(ushort *)((long)&local_378 + lVar42);
      uVar82 = *(ushort *)((long)&local_378 + lVar42 + 2);
      uVar83 = *(ushort *)((long)&local_378 + lVar42 + 4);
      uVar84 = *(ushort *)((long)&local_378 + lVar42 + 6);
      uVar85 = *(ushort *)((long)&uStack_370 + lVar42);
      uVar22 = *(ushort *)((long)&uStack_370 + lVar42 + 2);
      uVar23 = *(ushort *)((long)&uStack_370 + lVar42 + 4);
      uVar60 = *(ushort *)((long)&uStack_370 + lVar42 + 6);
      uVar64 = *(ushort *)((long)flat_pq[0] + lVar42) & local_3c8;
      uVar67 = *(ushort *)((long)flat_pq[0] + lVar42 + 2) & uStack_3c6;
      uVar68 = *(ushort *)((long)flat_pq[0] + lVar42 + 4) & uStack_3c4;
      uVar69 = *(ushort *)((long)flat_pq[0] + lVar42 + 6) & uStack_3c2;
      uVar70 = *(ushort *)((long)flat_pq[0] + lVar42 + 8) & local_3c8;
      uVar71 = *(ushort *)((long)flat_pq[0] + lVar42 + 10) & uStack_3c6;
      uVar72 = *(ushort *)((long)flat_pq[0] + lVar42 + 0xc) & uStack_3c4;
      uVar73 = *(ushort *)((long)flat_pq[0] + lVar42 + 0xe) & uStack_3c2;
      *(ushort *)((long)flat_pq[0] + lVar42) = uVar64;
      *(ushort *)((long)flat_pq[0] + lVar42 + 2) = uVar67;
      *(ushort *)((long)flat_pq[0] + lVar42 + 4) = uVar68;
      *(ushort *)((long)flat_pq[0] + lVar42 + 6) = uVar69;
      *(ushort *)((long)flat_pq[0] + lVar42 + 8) = uVar70;
      *(ushort *)((long)flat_pq[0] + lVar42 + 10) = uVar71;
      *(ushort *)((long)flat_pq[0] + lVar42 + 0xc) = uVar72;
      *(ushort *)((long)flat_pq[0] + lVar42 + 0xe) = uVar73;
      *(ushort *)((long)&local_378 + lVar42) = uVar64 | uVar81 & (local_3c8 ^ 0xffff);
      *(ushort *)((long)&local_378 + lVar42 + 2) = uVar67 | uVar82 & (uStack_3c6 ^ 0xffff);
      *(ushort *)((long)&local_378 + lVar42 + 4) = uVar68 | uVar83 & (uStack_3c4 ^ 0xffff);
      *(ushort *)((long)&local_378 + lVar42 + 6) = uVar69 | uVar84 & (uStack_3c2 ^ 0xffff);
      *(ushort *)((long)&uStack_370 + lVar42) = uVar70 | uVar85 & (local_3c8 ^ 0xffff);
      *(ushort *)((long)&uStack_370 + lVar42 + 2) = uVar71 | uVar22 & (uStack_3c6 ^ 0xffff);
      *(ushort *)((long)&uStack_370 + lVar42 + 4) = uVar72 | uVar23 & (uStack_3c4 ^ 0xffff);
      *(ushort *)((long)&uStack_370 + lVar42 + 6) = uVar73 | uVar60 & (uStack_3c2 ^ 0xffff);
    }
    if (uVar74 != 0) {
      for (lVar42 = 0; lVar42 != 0x60; lVar42 = lVar42 + 0x10) {
        uVar74 = *(ushort *)((long)&local_378 + lVar42);
        uVar81 = *(ushort *)((long)&local_378 + lVar42 + 2);
        uVar82 = *(ushort *)((long)&local_378 + lVar42 + 4);
        uVar83 = *(ushort *)((long)&local_378 + lVar42 + 6);
        uVar84 = *(ushort *)((long)&uStack_370 + lVar42);
        uVar85 = *(ushort *)((long)&uStack_370 + lVar42 + 2);
        uVar22 = *(ushort *)((long)&uStack_370 + lVar42 + 4);
        uVar23 = *(ushort *)((long)&uStack_370 + lVar42 + 6);
        uVar60 = *(ushort *)((long)local_1e8 + lVar42) & local_258;
        uVar64 = *(ushort *)((long)local_1e8 + lVar42 + 2) & uStack_256;
        uVar67 = *(ushort *)((long)local_1e8 + lVar42 + 4) & uStack_254;
        uVar68 = *(ushort *)((long)local_1e8 + lVar42 + 6) & uStack_252;
        uVar69 = *(ushort *)((long)local_1e8 + lVar42 + 8) & uStack_250;
        uVar70 = *(ushort *)((long)local_1e8 + lVar42 + 10) & uStack_24e;
        uVar71 = *(ushort *)((long)local_1e8 + lVar42 + 0xc) & uVar79;
        uVar72 = *(ushort *)((long)local_1e8 + lVar42 + 0xe) & uVar80;
        *(ushort *)((long)local_1e8 + lVar42) = uVar60;
        *(ushort *)((long)local_1e8 + lVar42 + 2) = uVar64;
        *(ushort *)((long)local_1e8 + lVar42 + 4) = uVar67;
        *(ushort *)((long)local_1e8 + lVar42 + 6) = uVar68;
        *(ushort *)((long)local_1e8 + lVar42 + 8) = uVar69;
        *(ushort *)((long)local_1e8 + lVar42 + 10) = uVar70;
        *(ushort *)((long)local_1e8 + lVar42 + 0xc) = uVar71;
        *(ushort *)((long)local_1e8 + lVar42 + 0xe) = uVar72;
        *(ushort *)((long)&local_378 + lVar42) = uVar60 | uVar74 & (local_258 ^ 0xffff);
        *(ushort *)((long)&local_378 + lVar42 + 2) = uVar64 | uVar81 & (uStack_256 ^ 0xffff);
        *(ushort *)((long)&local_378 + lVar42 + 4) = uVar67 | uVar82 & (uStack_254 ^ 0xffff);
        *(ushort *)((long)&local_378 + lVar42 + 6) = uVar68 | uVar83 & (uStack_252 ^ 0xffff);
        *(ushort *)((long)&uStack_370 + lVar42) = uVar69 | uVar84 & (uStack_250 ^ 0xffff);
        *(ushort *)((long)&uStack_370 + lVar42 + 2) = uVar70 | uVar85 & (uStack_24e ^ 0xffff);
        *(ushort *)((long)&uStack_370 + lVar42 + 4) = uVar71 | uVar22 & (uVar79 ^ 0xffff);
        *(ushort *)((long)&uStack_370 + lVar42 + 6) = uVar72 | uVar23 & (uVar80 ^ 0xffff);
      }
    }
    auVar108._2_2_ = sStack_366;
    auVar108._0_2_ = local_368;
    auVar108._4_2_ = sStack_364;
    auVar108._6_2_ = sStack_362;
    auVar108._8_2_ = sStack_360;
    auVar108._10_2_ = sStack_35e;
    auVar108._12_2_ = sStack_35c;
    auVar108._14_2_ = sStack_35a;
  }
  uVar45 = CONCAT22(auVar108._8_2_,(short)uStack_370);
  auVar46._0_8_ = CONCAT26(auVar108._10_2_,CONCAT24(uStack_370._2_2_,uVar45));
  auVar46._8_2_ = uStack_370._4_2_;
  auVar46._10_2_ = auVar108._12_2_;
  auVar49._12_2_ = uStack_370._6_2_;
  auVar49._0_12_ = auVar46;
  auVar49._14_2_ = auVar108._14_2_;
  auVar111._0_12_ = auVar108._0_12_;
  auVar111._12_2_ = auVar108._6_2_;
  auVar111._14_2_ = local_378._6_2_;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = auVar108._0_10_;
  auVar110._10_2_ = local_378._4_2_;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = auVar108._0_8_;
  auVar109._8_2_ = auVar108._4_2_;
  auVar27._4_8_ = auVar109._8_8_;
  auVar27._2_2_ = local_378._2_2_;
  auVar27._0_2_ = auVar108._2_2_;
  auVar54._12_2_ = local_268._6_2_;
  auVar54._0_12_ = local_268._0_12_;
  auVar54._14_2_ = p[6][0]._6_2_;
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._0_10_ = local_268._0_10_;
  auVar53._10_2_ = p[6][0]._4_2_;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52._0_8_ = local_268._0_8_;
  auVar52._8_2_ = local_268._4_2_;
  auVar28._4_8_ = auVar52._8_8_;
  auVar28._2_2_ = p[6][0]._2_2_;
  auVar28._0_2_ = local_268._2_2_;
  auVar51._0_4_ = CONCAT22((undefined2)p[6][0],local_268._0_2_);
  auVar51._4_12_ = auVar28;
  Var38 = CONCAT64(CONCAT42(CONCAT22(sStack_332,sStack_322),sStack_334),
                   CONCAT22(sStack_324,sStack_322));
  auVar29._4_8_ = (long)((unkuint10)Var38 >> 0x10);
  auVar29._2_2_ = sStack_336;
  auVar29._0_2_ = sStack_326;
  Var39 = CONCAT64(CONCAT42(CONCAT22(sStack_352,sStack_342),sStack_354),
                   CONCAT22(sStack_344,sStack_342));
  auVar30._4_8_ = (long)((unkuint10)Var39 >> 0x10);
  auVar30._2_2_ = sStack_356;
  auVar30._0_2_ = sStack_346;
  auVar105._0_4_ = CONCAT22(local_358,local_348);
  auVar105._4_12_ = auVar30;
  auVar63._0_8_ = auVar51._0_8_;
  auVar63._8_4_ = auVar28._0_4_;
  auVar63._12_4_ = auVar29._0_4_;
  auVar107._0_8_ = auVar105._0_8_;
  auVar107._8_4_ = auVar30._0_4_;
  auVar107._12_4_ = auVar27._0_4_;
  auVar65._0_8_ = CONCAT26(sStack_33e,CONCAT24(sStack_34e,CONCAT22(sStack_340,sStack_350)));
  auVar65._8_2_ = sStack_34c;
  auVar65._10_2_ = sStack_33c;
  auVar66._12_2_ = sStack_34a;
  auVar66._0_12_ = auVar65;
  auVar66._14_2_ = sStack_33a;
  auVar55._0_8_ = CONCAT26(sStack_31e,CONCAT24(sStack_32e,CONCAT22(sStack_320,sStack_330)));
  auVar55._8_2_ = sStack_32c;
  auVar55._10_2_ = sStack_31c;
  auVar58._12_2_ = sStack_32a;
  auVar58._0_12_ = auVar55;
  auVar58._14_2_ = sStack_31a;
  auVar93._12_2_ = local_2a8._6_2_;
  auVar93._0_12_ = local_2a8._0_12_;
  auVar93._14_2_ = d7_2[0]._6_2_;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = local_2a8._0_10_;
  auVar92._10_2_ = d7_2[0]._4_2_;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = local_2a8._0_8_;
  auVar91._8_2_ = local_2a8._4_2_;
  auVar31._4_8_ = auVar91._8_8_;
  auVar31._2_2_ = d7_2[0]._2_2_;
  auVar31._0_2_ = local_2a8._2_2_;
  auVar101._8_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
  auVar101._0_8_ = auVar46._0_8_;
  auVar101._12_4_ = (int)((ulong)auVar65._0_8_ >> 0x20);
  auVar106._8_4_ = (int)((ulong)auVar55._0_8_ >> 0x20);
  auVar106._0_8_ = auVar55._0_8_;
  auVar106._12_4_ = auVar31._0_4_;
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(local_338,local_328),auVar51._0_4_);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22((short)local_378,auVar108._0_2_),auVar105._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sStack_340,sStack_350),uVar45);
  *(ulong *)(s + 4) =
       CONCAT44(CONCAT22((undefined2)d7_2[0],local_2a8._0_2_),CONCAT22(sStack_320,sStack_330));
  *(long *)(s + (long)pitch + -8) = auVar63._8_8_;
  *(long *)(s + (long)pitch + -8 + 4) = auVar107._8_8_;
  *(long *)(s + pitch) = auVar101._8_8_;
  *(long *)(s + pitch + 4) = auVar106._8_8_;
  puVar1 = s + lVar43 + -8;
  *(int *)puVar1 = auVar52._8_4_;
  *(int *)(puVar1 + 2) = (int)((unkuint10)Var38 >> 0x10);
  *(int *)(puVar1 + 4) = (int)((unkuint10)Var39 >> 0x10);
  *(int *)(puVar1 + 6) = auVar109._8_4_;
  puVar1 = s + lVar43;
  *(int *)puVar1 = auVar46._8_4_;
  *(int *)(puVar1 + 2) = auVar65._8_4_;
  *(int *)(puVar1 + 4) = auVar55._8_4_;
  *(int *)(puVar1 + 6) = auVar91._8_4_;
  *(undefined4 *)(s + lVar44 + -4) = auVar53._12_4_;
  *(uint *)(s + lVar44 + -2) = CONCAT22(sStack_332,sStack_322);
  *(uint *)(s + lVar44) = CONCAT22(sStack_352,sStack_342);
  *(undefined4 *)(s + lVar44 + 2) = auVar110._12_4_;
  *(int *)(s + lVar44 + 4) = auVar49._12_4_;
  *(int *)(s + lVar44 + 6) = auVar66._12_4_;
  *(int *)(s + lVar44 + 8) = auVar58._12_4_;
  *(undefined4 *)(s + lVar44 + 10) = auVar92._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_sse2(uint16_t *s, int pitch,
                                     const uint8_t *blimit,
                                     const uint8_t *limit,
                                     const uint8_t *thresh, int bd) {
  __m128i q[7], p[7], pq[7];
  __m128i p6, p5, p4, p3;
  __m128i p6_2, p5_2, p4_2, p3_2;
  __m128i d0, d1, d2, d3;
  __m128i d0_2, d1_2, d2_2, d3_2, d7_2;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6, &p5, &p4, &p3, &d0, &p[6], &p[5], &p[4],
                               &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));

  highbd_transpose4x8_8x4_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &q[0], &q[1], &q[2],
                               &q[3], &q[4], &q[5], &q[6], &d7_2);

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  highbd_transpose8x8_low_sse2(&d0, &p[6], &pq[5], &pq[4], &pq[3], &pq[2],
                               &pq[1], &pq[0], &d0, &d1, &d2, &d3);

  q[0] = _mm_srli_si128(pq[0], 8);
  q[1] = _mm_srli_si128(pq[1], 8);
  q[2] = _mm_srli_si128(pq[2], 8);
  q[3] = _mm_srli_si128(pq[3], 8);
  q[4] = _mm_srli_si128(pq[4], 8);
  q[5] = _mm_srli_si128(pq[5], 8);

  highbd_transpose8x8_low_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6],
                               &d7_2, &d0_2, &d1_2, &d2_2, &d3_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0);
  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_2);

  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_2);
}